

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintServices(Generator *this)

{
  int iVar1;
  ServiceDescriptor *pSVar2;
  int local_14;
  int i;
  Generator *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = FileDescriptor::service_count(this->file_);
    if (iVar1 <= local_14) break;
    pSVar2 = FileDescriptor::service(this->file_,local_14);
    PrintServiceClass(this,pSVar2);
    pSVar2 = FileDescriptor::service(this->file_,local_14);
    PrintServiceStub(this,pSVar2);
    io::Printer::Print<>(this->printer_,"\n");
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Generator::PrintServices() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceClass(*file_->service(i));
    PrintServiceStub(*file_->service(i));
    printer_->Print("\n");
  }
}